

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int kex_method_curve25519_key_exchange(LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  kmdhgGPshakex_state_t *exchange_state;
  uchar **ppuVar1;
  size_t *psVar2;
  uint8_t *private_key;
  _func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *p_Var3;
  LIBSSH2_CRYPT_METHOD *pLVar4;
  _LIBSSH2_MAC_METHOD *p_Var5;
  LIBSSH2_COMP_METHOD *pLVar6;
  _func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *p_Var7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  BIGNUM *pBVar20;
  uchar *puVar21;
  uchar *puVar22;
  size_t sVar23;
  char *pcVar24;
  ulong uVar25;
  uchar *puVar26;
  size_t sVar27;
  uchar *server_public_key;
  uchar *local_98;
  EVP_MD_CTX *ctx;
  uint local_84;
  uchar *local_80;
  uchar *server_host_key;
  uint local_6c;
  size_t *local_68;
  size_t server_public_key_len;
  uchar *s;
  uchar *local_50;
  ulong local_48;
  uchar **local_40;
  size_t hostkey_len;
  
  if (key_state->state == libssh2_NB_state_idle) {
    key_state->public_key_oct = (uchar *)0x0;
    key_state->state = libssh2_NB_state_created;
  }
  iVar12 = 0;
  if (key_state->state == libssh2_NB_state_created) {
    s = (uchar *)0x0;
    pcVar24 = session->kex->name;
    iVar12 = strcmp(pcVar24,"curve25519-sha256@libssh.org");
    if ((iVar12 == 0) || (iVar12 = strcmp(pcVar24,"curve25519-sha256"), iVar12 == 0)) {
      iVar12 = _libssh2_curve25519_new
                         (session,&key_state->curve25519_public_key,
                          &key_state->curve25519_private_key);
      if (iVar12 != 0) {
        pcVar24 = "Unable to create private key";
        goto LAB_00114ea1;
      }
      key_state->request[0] = '\x1e';
      s = key_state->request + 1;
      _libssh2_store_str(&s,(char *)key_state->curve25519_public_key,0x20);
      key_state->request_len = 0x25;
      key_state->state = libssh2_NB_state_sent;
      bVar11 = true;
      iVar12 = 0;
    }
    else {
      pcVar24 = "Unknown KEX curve25519 curve type";
      iVar12 = -1;
LAB_00114ea1:
      iVar12 = _libssh2_error(session,iVar12,pcVar24);
      bVar11 = false;
    }
    if (!bVar11) goto LAB_0011524b;
  }
  if (key_state->state == libssh2_NB_state_sent) {
    iVar13 = _libssh2_transport_send
                       (session,key_state->request,key_state->request_len,(uchar *)0x0,0);
    if (iVar13 == -0x25) {
      return -0x25;
    }
    if (iVar13 == 0) {
      key_state->state = libssh2_NB_state_sent1;
      goto LAB_00114f29;
    }
    pcVar24 = "Unable to send ECDH_INIT";
LAB_00115033:
    iVar12 = _libssh2_error(session,iVar13,pcVar24);
    goto LAB_0011524b;
  }
LAB_00114f29:
  if (key_state->state == libssh2_NB_state_sent1) {
    iVar13 = _libssh2_packet_require
                       (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                        &key_state->req_state);
    if (iVar13 == -0x25) {
      return -0x25;
    }
    if (iVar13 != 0) {
      pcVar24 = "Timeout waiting for ECDH_REPLY reply";
      goto LAB_00115033;
    }
    key_state->state = libssh2_NB_state_sent2;
  }
  if (key_state->state != libssh2_NB_state_sent2) goto LAB_0011524b;
  uVar25 = key_state->data_len;
  if (uVar25 < 5) {
    iVar12 = _libssh2_error(session,-10,"Data is too short");
  }
  else {
    puVar21 = key_state->data;
    local_98 = key_state->curve25519_public_key;
    private_key = key_state->curve25519_private_key;
    exchange_state = &key_state->exchange_state;
    if (exchange_state->state == libssh2_NB_state_idle) {
      pBVar20 = BN_new();
      (key_state->exchange_state).k = (BIGNUM *)pBVar20;
      (key_state->exchange_state).state = libssh2_NB_state_created;
    }
    iVar13 = 0;
    if (exchange_state->state == libssh2_NB_state_created) {
      local_50 = puVar21 + 1;
      s = puVar21;
      local_48 = uVar25;
      iVar12 = _libssh2_get_string((string_buf *)&s,&server_host_key,&hostkey_len);
      if (iVar12 != 0) {
        pcVar24 = "Unexpected curve25519 key length 2";
LAB_0011501f:
        iVar12 = -0xe;
        goto LAB_00115165;
      }
      session->server_hostkey_len = (uint32_t)hostkey_len;
      puVar21 = (uchar *)(*session->alloc)(hostkey_len & 0xffffffff,&session->abstract);
      session->server_hostkey = puVar21;
      if (puVar21 == (uchar *)0x0) {
        pcVar24 = "Unable to allocate memory for a copy of the host curve25519 key";
LAB_0011515d:
        iVar12 = -6;
        goto LAB_00115165;
      }
      memcpy(puVar21,(void *)CONCAT44(server_host_key._4_4_,(int)server_host_key),
             (ulong)session->server_hostkey_len);
      iVar12 = _libssh2_sha1_init((EVP_MD_CTX **)&server_public_key);
      if ((iVar12 == 0) ||
         (iVar12 = _libssh2_sha1_update
                             ((EVP_MD_CTX **)&server_public_key,session->server_hostkey,
                              (ulong)session->server_hostkey_len), iVar12 == 0)) {
LAB_001150c2:
        iVar13 = 0;
      }
      else {
        iVar12 = _libssh2_sha1_final((EVP_MD_CTX **)&server_public_key,session->server_hostkey_sha1)
        ;
        iVar13 = 1;
        if (iVar12 == 0) goto LAB_001150c2;
      }
      session->server_hostkey_sha1_valid = iVar13;
      iVar12 = _libssh2_sha256_init((EVP_MD_CTX **)&server_public_key);
      if ((iVar12 == 0) ||
         (iVar12 = _libssh2_sha256_update
                             ((EVP_MD_CTX **)&server_public_key,session->server_hostkey,
                              (ulong)session->server_hostkey_len), iVar12 == 0)) {
LAB_0011510f:
        iVar13 = 0;
      }
      else {
        iVar12 = _libssh2_sha256_final
                           ((EVP_MD_CTX **)&server_public_key,session->server_hostkey_sha256);
        iVar13 = 1;
        if (iVar12 == 0) goto LAB_0011510f;
      }
      session->server_hostkey_sha256_valid = iVar13;
      iVar12 = (*session->hostkey->init)
                         (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                          &session->server_hostkey_abstract);
      if (iVar12 != 0) {
        pcVar24 = "Unable to initialize hostkey importer curve25519";
        goto LAB_0011514c;
      }
      iVar12 = _libssh2_get_string((string_buf *)&s,&server_public_key,&server_public_key_len);
      if (iVar12 != 0) {
        pcVar24 = "Unexpected curve25519 key length";
        goto LAB_0011501f;
      }
      if (CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len) == 0x20) {
        ppuVar1 = &(key_state->exchange_state).h_sig;
        psVar2 = &(key_state->exchange_state).h_sig_len;
        iVar12 = _libssh2_get_string((string_buf *)&s,ppuVar1,psVar2);
        if (iVar12 != 0) {
          pcVar24 = "Unexpected curve25519 server sig length";
          goto LAB_0011514c;
        }
        local_68 = psVar2;
        iVar12 = _libssh2_curve25519_gen_k
                           (&(key_state->exchange_state).k,private_key,
                            (uint8_t *)CONCAT44(server_public_key._4_4_,(int)server_public_key));
        if (iVar12 != 0) {
          pcVar24 = "Unable to create curve25519 shared secret";
          iVar12 = -5;
          goto LAB_00115165;
        }
        local_40 = ppuVar1;
        iVar13 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        iVar12 = iVar13 + 0xe;
        if (-1 < iVar13 + 7) {
          iVar12 = iVar13 + 7;
        }
        (key_state->exchange_state).k_value_len = (long)((iVar12 >> 3) + 5);
        uVar15 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        if ((uVar15 & 7) != 0) {
          psVar2 = &(key_state->exchange_state).k_value_len;
          *psVar2 = *psVar2 - 1;
        }
        puVar21 = (uchar *)(*session->alloc)((key_state->exchange_state).k_value_len,
                                             &session->abstract);
        (key_state->exchange_state).k_value = puVar21;
        if (puVar21 == (uchar *)0x0) {
          pcVar24 = "Unable to allocate buffer for K";
          goto LAB_0011515d;
        }
        _libssh2_htonu32(puVar21,(int)(key_state->exchange_state).k_value_len - 4);
        uVar15 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        if ((uVar15 & 7) == 0) {
          (key_state->exchange_state).k_value[4] = '\0';
          pBVar20 = (BIGNUM *)(key_state->exchange_state).k;
          puVar21 = (key_state->exchange_state).k_value + 5;
        }
        else {
          pBVar20 = (BIGNUM *)(key_state->exchange_state).k;
          puVar21 = (key_state->exchange_state).k_value + 4;
        }
        iVar12 = BN_bn2bin(pBVar20,puVar21);
        if (iVar12 < 1) {
          pcVar24 = "Can\'t write exchange_state->e";
          iVar12 = -0x29;
          goto LAB_00115165;
        }
        iVar12 = _libssh2_sha256_init(&ctx);
        if (iVar12 == 0) {
LAB_0011615f:
          pcVar24 = "Unable to verify hostkey signature curve25519";
          iVar12 = -0xb;
          goto LAB_00115165;
        }
        (key_state->exchange_state).exchange_hash = &ctx;
        puVar22 = (session->local).banner;
        puVar21 = (key_state->exchange_state).h_sig_comp;
        local_80 = puVar21;
        if (puVar22 == (uchar *)0x0) {
          _libssh2_htonu32(puVar21,0x1a);
          uVar15 = _libssh2_sha256_update(&ctx,puVar21,4);
          local_84 = _libssh2_sha256_update(&ctx,"SSH-2.0-libssh2_1.11.2_DEV",0x1a);
          local_84 = local_84 & uVar15;
        }
        else {
          sVar23 = strlen((char *)puVar22);
          puVar21 = local_80;
          _libssh2_htonu32(local_80,(int)sVar23 - 2);
          uVar15 = _libssh2_sha256_update(&ctx,puVar21,4);
          puVar21 = (session->local).banner;
          sVar23 = strlen((char *)puVar21);
          local_84 = _libssh2_sha256_update(&ctx,puVar21,sVar23 - 2);
          local_84 = local_84 & uVar15;
        }
        local_84 = local_84 & 1;
        sVar23 = strlen((char *)(session->remote).banner);
        puVar22 = local_80;
        _libssh2_htonu32(local_80,(uint32_t)sVar23);
        local_6c = _libssh2_sha256_update(&ctx,puVar22,4);
        puVar21 = (session->remote).banner;
        sVar23 = strlen((char *)puVar21);
        uVar15 = _libssh2_sha256_update(&ctx,puVar21,sVar23);
        uVar15 = uVar15 & local_6c;
        _libssh2_htonu32(puVar22,(uint32_t)(session->local).kexinit_len);
        uVar16 = _libssh2_sha256_update(&ctx,puVar22,4);
        uVar17 = _libssh2_sha256_update(&ctx,(session->local).kexinit,(session->local).kexinit_len);
        local_84 = uVar17 & uVar16 & uVar15 & local_84;
        _libssh2_htonu32(puVar22,(uint32_t)(session->remote).kexinit_len);
        local_6c = _libssh2_sha256_update(&ctx,puVar22,4);
        uVar15 = _libssh2_sha256_update
                           (&ctx,(session->remote).kexinit,(session->remote).kexinit_len);
        uVar15 = uVar15 & local_6c;
        _libssh2_htonu32(puVar22,session->server_hostkey_len);
        uVar16 = _libssh2_sha256_update(&ctx,puVar22,4);
        uVar17 = _libssh2_sha256_update
                           (&ctx,session->server_hostkey,(ulong)session->server_hostkey_len);
        _libssh2_htonu32(puVar22,0x20);
        uVar18 = _libssh2_sha256_update(&ctx,puVar22,4);
        uVar19 = _libssh2_sha256_update(&ctx,local_98,0x20);
        uVar17 = uVar19 & uVar18 & uVar17 & uVar16 & uVar15 & local_84;
        _libssh2_htonu32(local_80,(uint32_t)server_public_key_len);
        iVar12 = _libssh2_sha256_update(&ctx,local_80,4);
        local_98 = (uchar *)CONCAT44(local_98._4_4_,iVar12);
        uVar15 = _libssh2_sha256_update
                           (&ctx,(void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                            CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len));
        uVar15 = uVar15 & (uint)local_98;
        uVar16 = _libssh2_sha256_update
                           (&ctx,(key_state->exchange_state).k_value,
                            (key_state->exchange_state).k_value_len);
        if ((((uVar15 & uVar17 & uVar16) == 0) ||
            (iVar12 = _libssh2_sha256_final(&ctx,local_80), iVar12 == 0)) ||
           (iVar12 = (*session->hostkey->sig_verify)
                               (session,*local_40,*local_68,local_80,0x20,
                                &session->server_hostkey_abstract), iVar12 != 0)) goto LAB_0011615f;
        (key_state->exchange_state).c = '\x15';
        (key_state->exchange_state).state = libssh2_NB_state_sent;
        bVar11 = true;
        iVar13 = 0;
      }
      else {
        pcVar24 = "Unexpected curve25519 server public key length";
LAB_0011514c:
        iVar12 = -10;
LAB_00115165:
        iVar13 = _libssh2_error(session,iVar12,pcVar24);
        bVar11 = false;
      }
      iVar12 = iVar13;
      if (bVar11) goto LAB_00115177;
    }
    else {
LAB_00115177:
      if (exchange_state->state == libssh2_NB_state_sent) {
        iVar12 = _libssh2_transport_send(session,&(key_state->exchange_state).c,1,(uchar *)0x0,0);
        if (iVar12 == -0x25) goto LAB_00115240;
        if (iVar12 == 0) {
          exchange_state->state = libssh2_NB_state_sent2;
          goto LAB_001151af;
        }
        pcVar24 = "Unable to send NEWKEYS message curve25519";
LAB_00115227:
        iVar12 = _libssh2_error(session,iVar12,pcVar24);
      }
      else {
LAB_001151af:
        iVar12 = iVar13;
        if (exchange_state->state == libssh2_NB_state_sent2) {
          ppuVar1 = &(key_state->exchange_state).tmp;
          iVar12 = _libssh2_packet_require
                             (session,'\x15',ppuVar1,&(key_state->exchange_state).tmp_len,0,
                              (uchar *)0x0,0,&(key_state->exchange_state).req_state);
          if (iVar12 == -0x25) goto LAB_00115240;
          if (iVar12 != 0) {
            pcVar24 = "Timed out waiting for NEWKEYS curve25519";
            goto LAB_00115227;
          }
          *(byte *)&session->state = (byte)session->state | 4;
          (*session->free)(*ppuVar1,&session->abstract);
          if (session->session_id == (uchar *)0x0) {
            puVar21 = (uchar *)(*session->alloc)(0x20,&session->abstract);
            session->session_id = puVar21;
            if (puVar21 == (uchar *)0x0) {
              iVar12 = _libssh2_error(session,-6,"Unable to allocate buffer for SHA digest");
              goto LAB_00115235;
            }
            uVar8 = *(undefined8 *)(key_state->exchange_state).h_sig_comp;
            uVar9 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 8);
            uVar10 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x18);
            *(undefined8 *)(puVar21 + 0x10) =
                 *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x10);
            *(undefined8 *)(puVar21 + 0x18) = uVar10;
            *(undefined8 *)puVar21 = uVar8;
            *(undefined8 *)(puVar21 + 8) = uVar9;
            session->session_id_len = 0x20;
          }
          p_Var3 = ((session->local).crypt)->dtor;
          if (p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var3)(session,&(session->local).crypt_abstract);
          }
          pLVar4 = (session->local).crypt;
          if (pLVar4->init !=
              (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
               *)0x0) {
            local_98 = (uchar *)CONCAT44(local_98._4_4_,iVar13);
            server_public_key._0_4_ = 0;
            server_host_key._0_4_ = 0;
            puVar21 = (uchar *)(*session->alloc)((long)pLVar4->iv_len + 0x20,&session->abstract);
            if (puVar21 == (uchar *)0x0) {
LAB_00115463:
              puVar21 = (uchar *)0x0;
            }
            else if (((session->local).crypt)->iv_len != 0) {
              sVar27 = 0;
              do {
                iVar12 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
                if (((iVar12 == 0) ||
                    (iVar12 = _libssh2_sha256_update
                                        ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                         (key_state->exchange_state).k_value_len), iVar12 == 0)) ||
                   (iVar12 = _libssh2_sha256_update
                                       ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,
                                        0x20), iVar12 == 0)) {
LAB_00115459:
                  (*session->free)(puVar21,&session->abstract);
                  goto LAB_00115463;
                }
                uVar25 = sVar27;
                puVar22 = puVar21;
                if (sVar27 == 0) {
                  iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"A",1);
                  if (iVar12 == 0) goto LAB_00115459;
                  uVar25 = (ulong)session->session_id_len;
                  puVar22 = session->session_id;
                }
                iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar22,uVar25);
                if ((iVar12 == 0) ||
                   (iVar12 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar21 + sVar27), iVar12 == 0)
                   ) goto LAB_00115459;
                sVar27 = sVar27 + 0x20;
              } while (sVar27 < (ulong)(long)((session->local).crypt)->iv_len);
            }
            if (puVar21 == (uchar *)0x0) {
              iVar13 = -1;
              bVar11 = false;
            }
            else {
              puVar22 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len + 0x20
                                                   ,&session->abstract);
              if (puVar22 == (uchar *)0x0) {
LAB_00115584:
                puVar22 = (uchar *)0x0;
              }
              else if (((session->local).crypt)->secret_len != 0) {
                local_68 = (size_t *)(key_state->exchange_state).h_sig_comp;
                sVar27 = 0;
                do {
                  iVar12 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
                  if (((iVar12 == 0) ||
                      (iVar12 = _libssh2_sha256_update
                                          ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                           (key_state->exchange_state).k_value_len), iVar12 == 0))
                     || (iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,local_68,0x20),
                        iVar12 == 0)) {
LAB_00115579:
                    (*session->free)(puVar22,&session->abstract);
                    goto LAB_00115584;
                  }
                  uVar25 = sVar27;
                  puVar26 = puVar22;
                  if (sVar27 == 0) {
                    iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"C",1);
                    if (iVar12 == 0) goto LAB_00115579;
                    uVar25 = (ulong)session->session_id_len;
                    puVar26 = session->session_id;
                  }
                  iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar26,uVar25);
                  if ((iVar12 == 0) ||
                     (iVar12 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar22 + sVar27),
                     iVar12 == 0)) goto LAB_00115579;
                  sVar27 = sVar27 + 0x20;
                } while (sVar27 < (ulong)(long)((session->local).crypt)->secret_len);
              }
              if (puVar22 == (uchar *)0x0) {
LAB_001155d7:
                puVar22 = puVar21;
                bVar11 = false;
                iVar13 = -5;
              }
              else {
                pLVar4 = (session->local).crypt;
                iVar12 = (*pLVar4->init)(session,pLVar4,puVar21,(int *)&server_public_key,puVar22,
                                         (int *)&server_host_key,1,&(session->local).crypt_abstract)
                ;
                if (iVar12 != 0) {
                  (*session->free)(puVar21,&session->abstract);
                  puVar21 = puVar22;
                  goto LAB_001155d7;
                }
                if ((int)server_public_key != 0) {
                  explicit_bzero(puVar21,(long)((session->local).crypt)->iv_len);
                  (*session->free)(puVar21,&session->abstract);
                }
                if ((int)server_host_key == 0) {
                  bVar11 = true;
                  iVar13 = (uint)local_98;
                  goto LAB_001155e4;
                }
                explicit_bzero(puVar22,(long)((session->local).crypt)->secret_len);
                bVar11 = true;
                iVar13 = (uint)local_98;
              }
              (*session->free)(puVar22,&session->abstract);
            }
LAB_001155e4:
            iVar12 = iVar13;
            if (!bVar11) goto LAB_00115235;
          }
          p_Var3 = ((session->remote).crypt)->dtor;
          if (p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var3)(session,&(session->remote).crypt_abstract);
          }
          pLVar4 = (session->remote).crypt;
          if (pLVar4->init !=
              (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
               *)0x0) {
            local_98 = (uchar *)CONCAT44(local_98._4_4_,iVar13);
            server_public_key._0_4_ = 0;
            server_host_key._0_4_ = 0;
            puVar21 = (uchar *)(*session->alloc)((long)pLVar4->iv_len + 0x20,&session->abstract);
            if (puVar21 == (uchar *)0x0) {
LAB_00115727:
              puVar21 = (uchar *)0x0;
            }
            else if (((session->remote).crypt)->iv_len != 0) {
              sVar27 = 0;
              do {
                iVar12 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
                if (((iVar12 == 0) ||
                    (iVar12 = _libssh2_sha256_update
                                        ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                         (key_state->exchange_state).k_value_len), iVar12 == 0)) ||
                   (iVar12 = _libssh2_sha256_update
                                       ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,
                                        0x20), iVar12 == 0)) {
LAB_0011571d:
                  (*session->free)(puVar21,&session->abstract);
                  goto LAB_00115727;
                }
                uVar25 = sVar27;
                puVar22 = puVar21;
                if (sVar27 == 0) {
                  iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"B",1);
                  if (iVar12 == 0) goto LAB_0011571d;
                  uVar25 = (ulong)session->session_id_len;
                  puVar22 = session->session_id;
                }
                iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar22,uVar25);
                if ((iVar12 == 0) ||
                   (iVar12 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar21 + sVar27), iVar12 == 0)
                   ) goto LAB_0011571d;
                sVar27 = sVar27 + 0x20;
              } while (sVar27 < (ulong)(long)((session->remote).crypt)->iv_len);
            }
            if (puVar21 == (uchar *)0x0) {
              iVar13 = -5;
              bVar11 = false;
            }
            else {
              puVar22 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->secret_len +
                                                   0x20,&session->abstract);
              if (puVar22 == (uchar *)0x0) {
LAB_001158b9:
                puVar22 = (uchar *)0x0;
              }
              else if (((session->remote).crypt)->secret_len != 0) {
                local_68 = (size_t *)(key_state->exchange_state).h_sig_comp;
                sVar27 = 0;
                do {
                  iVar12 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
                  if (((iVar12 == 0) ||
                      (iVar12 = _libssh2_sha256_update
                                          ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                           (key_state->exchange_state).k_value_len), iVar12 == 0))
                     || (iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,local_68,0x20),
                        iVar12 == 0)) {
LAB_001158ae:
                    (*session->free)(puVar22,&session->abstract);
                    goto LAB_001158b9;
                  }
                  uVar25 = sVar27;
                  puVar26 = puVar22;
                  if (sVar27 == 0) {
                    iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"D",1);
                    if (iVar12 == 0) goto LAB_001158ae;
                    uVar25 = (ulong)session->session_id_len;
                    puVar26 = session->session_id;
                  }
                  iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar26,uVar25);
                  if ((iVar12 == 0) ||
                     (iVar12 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar22 + sVar27),
                     iVar12 == 0)) goto LAB_001158ae;
                  sVar27 = sVar27 + 0x20;
                } while (sVar27 < (ulong)(long)((session->remote).crypt)->secret_len);
              }
              if (puVar22 == (uchar *)0x0) {
LAB_0011590c:
                puVar22 = puVar21;
                bVar11 = false;
                iVar13 = -5;
              }
              else {
                pLVar4 = (session->remote).crypt;
                iVar12 = (*pLVar4->init)(session,pLVar4,puVar21,(int *)&server_public_key,puVar22,
                                         (int *)&server_host_key,0,&(session->remote).crypt_abstract
                                        );
                if (iVar12 != 0) {
                  (*session->free)(puVar21,&session->abstract);
                  puVar21 = puVar22;
                  goto LAB_0011590c;
                }
                if ((int)server_public_key != 0) {
                  explicit_bzero(puVar21,(long)((session->remote).crypt)->iv_len);
                  (*session->free)(puVar21,&session->abstract);
                }
                if ((int)server_host_key == 0) {
                  bVar11 = true;
                  iVar13 = (uint)local_98;
                  goto LAB_00115919;
                }
                explicit_bzero(puVar22,(long)((session->remote).crypt)->secret_len);
                bVar11 = true;
                iVar13 = (uint)local_98;
              }
              (*session->free)(puVar22,&session->abstract);
            }
LAB_00115919:
            iVar12 = iVar13;
            if (!bVar11) goto LAB_00115235;
          }
          p_Var3 = ((session->local).mac)->dtor;
          if (p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var3)(session,&(session->local).mac_abstract);
          }
          p_Var5 = (session->local).mac;
          if (p_Var5->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
            local_98 = (uchar *)CONCAT44(local_98._4_4_,iVar13);
            server_public_key._0_4_ = 0;
            puVar21 = (uchar *)(*session->alloc)((long)p_Var5->key_len + 0x20,&session->abstract);
            if (puVar21 == (uchar *)0x0) {
LAB_00115a58:
              puVar21 = (uchar *)0x0;
            }
            else if (((session->local).mac)->key_len != 0) {
              sVar27 = 0;
              do {
                iVar12 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
                if (((iVar12 == 0) ||
                    (iVar12 = _libssh2_sha256_update
                                        ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                         (key_state->exchange_state).k_value_len), iVar12 == 0)) ||
                   (iVar12 = _libssh2_sha256_update
                                       ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,
                                        0x20), iVar12 == 0)) {
LAB_00115a4e:
                  (*session->free)(puVar21,&session->abstract);
                  goto LAB_00115a58;
                }
                uVar25 = sVar27;
                puVar22 = puVar21;
                if (sVar27 == 0) {
                  iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"E",1);
                  if (iVar12 == 0) goto LAB_00115a4e;
                  uVar25 = (ulong)session->session_id_len;
                  puVar22 = session->session_id;
                }
                iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar22,uVar25);
                if ((iVar12 == 0) ||
                   (iVar12 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar21 + sVar27), iVar12 == 0)
                   ) goto LAB_00115a4e;
                sVar27 = sVar27 + 0x20;
              } while (sVar27 < (ulong)(long)((session->local).mac)->key_len);
            }
            if (puVar21 == (uchar *)0x0) {
              iVar13 = -5;
            }
            else {
              (*((session->local).mac)->init)
                        (session,puVar21,(int *)&server_public_key,&(session->local).mac_abstract);
              if ((int)server_public_key != 0) {
                explicit_bzero(puVar21,(long)((session->local).mac)->key_len);
                (*session->free)(puVar21,&session->abstract);
              }
              iVar13 = (uint)local_98;
            }
            iVar12 = iVar13;
            if (puVar21 == (uchar *)0x0) goto LAB_00115235;
          }
          p_Var3 = ((session->remote).mac)->dtor;
          if (p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var3)(session,&(session->remote).mac_abstract);
          }
          p_Var5 = (session->remote).mac;
          if (p_Var5->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
            local_98 = (uchar *)CONCAT44(local_98._4_4_,iVar13);
            server_public_key._0_4_ = 0;
            puVar21 = (uchar *)(*session->alloc)((long)p_Var5->key_len + 0x20,&session->abstract);
            if (puVar21 == (uchar *)0x0) {
LAB_00115bed:
              puVar21 = (uchar *)0x0;
            }
            else if (((session->remote).mac)->key_len != 0) {
              sVar27 = 0;
              do {
                iVar12 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
                if (((iVar12 == 0) ||
                    (iVar12 = _libssh2_sha256_update
                                        ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                         (key_state->exchange_state).k_value_len), iVar12 == 0)) ||
                   (iVar12 = _libssh2_sha256_update
                                       ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,
                                        0x20), iVar12 == 0)) {
LAB_00115be3:
                  (*session->free)(puVar21,&session->abstract);
                  goto LAB_00115bed;
                }
                uVar25 = sVar27;
                puVar22 = puVar21;
                if (sVar27 == 0) {
                  iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"F",1);
                  if (iVar12 == 0) goto LAB_00115be3;
                  uVar25 = (ulong)session->session_id_len;
                  puVar22 = session->session_id;
                }
                iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar22,uVar25);
                if ((iVar12 == 0) ||
                   (iVar12 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar21 + sVar27), iVar12 == 0)
                   ) goto LAB_00115be3;
                sVar27 = sVar27 + 0x20;
              } while (sVar27 < (ulong)(long)((session->remote).mac)->key_len);
            }
            if (puVar21 == (uchar *)0x0) {
              iVar13 = -5;
            }
            else {
              (*((session->remote).mac)->init)
                        (session,puVar21,(int *)&server_public_key,&(session->remote).mac_abstract);
              if ((int)server_public_key != 0) {
                explicit_bzero(puVar21,(long)((session->remote).mac)->key_len);
                (*session->free)(puVar21,&session->abstract);
              }
              iVar13 = (uint)local_98;
            }
            iVar12 = iVar13;
            if (puVar21 == (uchar *)0x0) goto LAB_00115235;
          }
          pLVar6 = (session->local).comp;
          if ((pLVar6 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var7 = pLVar6->dtor, p_Var7 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            (*p_Var7)(session,1,&(session->local).comp_abstract);
          }
          pLVar6 = (session->local).comp;
          if ((pLVar6 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var7 = pLVar6->init, p_Var7 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            iVar14 = (*p_Var7)(session,1,&(session->local).comp_abstract);
            iVar12 = -5;
            if (iVar14 != 0) goto LAB_00115235;
          }
          pLVar6 = (session->remote).comp;
          if ((pLVar6 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var7 = pLVar6->dtor, p_Var7 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            (*p_Var7)(session,0,&(session->remote).comp_abstract);
          }
          pLVar6 = (session->remote).comp;
          iVar12 = iVar13;
          if ((pLVar6 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var7 = pLVar6->init, p_Var7 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            iVar14 = (*p_Var7)(session,0,&(session->remote).comp_abstract);
            iVar12 = -5;
            if (iVar14 == 0) {
              iVar12 = iVar13;
            }
          }
        }
      }
    }
LAB_00115235:
    curve25519_exchange_state_cleanup(session,exchange_state);
  }
LAB_00115240:
  if (iVar12 == -0x25) {
    return -0x25;
  }
LAB_0011524b:
  kex_method_curve25519_cleanup(session,key_state);
  return iVar12;
}

Assistant:

static int
kex_method_curve25519_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc = 0;

    if(key_state->state == libssh2_NB_state_idle) {

        key_state->public_key_oct = NULL;
        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        unsigned char *s = NULL;

        rc = strcmp(session->kex->name, "curve25519-sha256@libssh.org");
        if(rc)
            rc = strcmp(session->kex->name, "curve25519-sha256");

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX curve25519 curve type");
            goto clean_exit;
        }

        rc = _libssh2_curve25519_new(session,
                                     &key_state->curve25519_public_key,
                                     &key_state->curve25519_private_key);

        if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to create private key");
            goto clean_exit;
        }

        key_state->request[0] = SSH2_MSG_KEX_ECDH_INIT;
        s = key_state->request + 1;
        _libssh2_store_str(&s, (const char *)key_state->curve25519_public_key,
                           LIBSSH2_ED25519_KEY_LEN);
        key_state->request_len = LIBSSH2_ED25519_KEY_LEN + 5;

        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating curve25519 SHA2"));

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send ECDH_INIT");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        rc = _libssh2_packet_require(session, SSH2_MSG_KEX_ECDH_REPLY,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for ECDH_REPLY reply");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent2;
    }

    if(key_state->state == libssh2_NB_state_sent2) {

        ret = curve25519_sha256(session, key_state->data, key_state->data_len,
                                key_state->curve25519_public_key,
                                key_state->curve25519_private_key,
                                &key_state->exchange_state);

        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }
    }

clean_exit:

    kex_method_curve25519_cleanup(session, key_state);

    return ret;
}